

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_base.h
# Opt level: O2

void __thiscall
mp::
CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_>_>
::CustomFunctionalConstraint
          (CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_>_>
           *this,Arguments *args)

{
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_> local_1f0;
  
  (this->super_FunctionalConstraint).super_BasicConstraint.name_._M_dataplus._M_p =
       (pointer)&(this->super_FunctionalConstraint).super_BasicConstraint.name_.field_2;
  (this->super_FunctionalConstraint).super_BasicConstraint.name_._M_string_length = 0;
  (this->super_FunctionalConstraint).super_BasicConstraint.name_.field_2._M_local_buf[0] = '\0';
  (this->super_FunctionalConstraint).result_var_ = -1;
  (this->super_FunctionalConstraint).ctx = CTX_NONE;
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>::AlgebraicConstraint(&local_1f0,args);
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>::AlgebraicConstraint
            (&(this->
              super_CustomConstraintData<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_>_>
              ).args_,&local_1f0);
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>::~AlgebraicConstraint(&local_1f0);
  return;
}

Assistant:

CustomFunctionalConstraint(Arguments args) noexcept :
    BaseType(std::move(args)) { }